

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::ReadableFile>_> __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  undefined1 auVar1 [8];
  size_t sVar2;
  int iVar3;
  int code;
  undefined4 extraout_var;
  DiskHandle DVar5;
  Disposer *extraout_RAX;
  Disposer *extraout_RAX_00;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar6;
  AutoCloseFd __file;
  Maybe<kj::Own<const_kj::ReadableFile>_> MVar7;
  AutoCloseFd result;
  undefined1 local_68 [8];
  size_t sStack_60;
  ArrayDisposer *local_58;
  AutoCloseFd local_48;
  PathPtr local_40;
  Disposer *pDVar4;
  
  local_40.parts.ptr = (String *)path.parts.size_;
  do {
    iVar3 = *(int *)&((path.parts.ptr)->content).ptr;
    PathPtr::toString((String *)local_68,&local_40,false);
    __file = (AutoCloseFd)((long)"ab\"cd\\ef\x03" + 9);
    if (sStack_60 != 0) {
      __file = (AutoCloseFd)local_68;
    }
    iVar3 = openat(iVar3,(char *)__file,0x80000);
    sVar2 = sStack_60;
    auVar1 = local_68;
    if ((AutoCloseFd)local_68 != (AutoCloseFd)0x0) {
      local_68._0_4_ = 0;
      local_68._4_4_ = 0;
      sStack_60 = 0;
      (**local_58->_vptr_ArrayDisposer)(local_58,auVar1,1,sVar2,sVar2,0);
    }
    if (-1 < iVar3) goto LAB_004a1b9d;
    code = kj::_::Debug::getOsErrorNumber(false);
    pDVar4 = (Disposer *)CONCAT44(extraout_var,code);
  } while (code == -1);
  if (code == 0) {
LAB_004a1b9d:
    local_68._0_4_ = iVar3;
    UnwindDetector::UnwindDetector((UnwindDetector *)(local_68 + 4));
    local_48.fd = local_68._0_4_;
    UnwindDetector::UnwindDetector(&local_48.unwindDetector);
    local_68._0_4_ = -1;
    DVar5.fd = (AutoCloseFd)operator_new(0x10);
    *(undefined ***)DVar5.fd = &PTR_getFd_0062fc60;
    *(int *)((long)DVar5.fd + 8) = local_48.fd;
    UnwindDetector::UnwindDetector((UnwindDetector *)((long)DVar5.fd + 0xc));
    local_48.fd = -1;
    *(undefined ***)DVar5.fd = &PTR_getFd_0062f1b0;
    this->fd = (AutoCloseFd)
               &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableFile>::instance;
    this[1].fd = DVar5.fd;
    AutoCloseFd::~AutoCloseFd(&local_48);
    AutoCloseFd::~AutoCloseFd((AutoCloseFd *)local_68);
    pDVar4 = extraout_RAX;
    pRVar6 = extraout_RDX_00;
  }
  else if ((code == 0x14) || (code == 2)) {
    this->fd = (AutoCloseFd)0x0;
    this[1].fd.fd = 0;
    this[1].fd.unwindDetector = 0;
    pRVar6 = extraout_RDX;
  }
  else {
    kj::_::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2e9,code,"openat(fd, path, O_RDONLY)","path",&local_40);
    this->fd = (AutoCloseFd)0x0;
    this[1].fd.fd = 0;
    this[1].fd.unwindDetector = 0;
    kj::_::Debug::Fault::~Fault((Fault *)local_68);
    pDVar4 = extraout_RAX_00;
    pRVar6 = extraout_RDX_01;
  }
  MVar7.ptr.ptr = pRVar6;
  MVar7.ptr.disposer = pDVar4;
  return (Maybe<kj::Own<const_kj::ReadableFile>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return nullptr;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }